

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

bool units::hasAdditionalOps(string *unit_string)

{
  long lVar1;
  bool bVar2;
  
  std::__cxx11::string::rfind((char)unit_string,0x7b);
  lVar1 = std::__cxx11::string::find_last_of((char *)unit_string,0x16890a);
  bVar2 = true;
  if (lVar1 == -1) {
    std::__cxx11::string::rfind((char)unit_string,0x7d);
    lVar1 = std::__cxx11::string::find_first_of((char *)unit_string,0x16890a);
    bVar2 = lVar1 != -1;
  }
  return bVar2;
}

Assistant:

static bool hasAdditionalOps(const std::string& unit_string)
{
    return (unit_string.find_last_of("*^(/", unit_string.find_last_of('{')) !=
            std::string::npos) ||
        (unit_string.find_first_of("*^(/", unit_string.find_last_of('}')) !=
         std::string::npos);
}